

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticLine>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  long lVar4;
  _Base_ptr p_Var5;
  mapped_type_conflict *pmVar6;
  _Rb_tree_header *p_Var7;
  TPZGeoElSide neigh;
  long local_a0;
  TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *local_98;
  TPZGeoElSide local_90;
  pointer_____offset_0x60___ *local_78;
  TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *local_70;
  TPZGeoElSideIndex *local_68;
  TPZGeoElSideIndex *local_60;
  long local_58;
  long local_50;
  undefined **local_48;
  TPZGeoEl *local_40;
  int local_38;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018d6690;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018d62e8,DestMesh,&cp->super_TPZGeoEl,gl2lcElMap
                    );
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018d5fe8;
  local_78 = &PTR_PTR_018d62e8;
  local_98 = cp;
  local_70 = this;
  pzgeom::TPZNodeRep<3,_pztopology::TPZLine>::TPZNodeRep
            (&(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>,&PTR_PTR_018d8bd8,
             &(cp->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>,gl2lcNdMap);
  (this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine>.super_TPZLine.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZQuadraticLine_018d8b80;
  lVar4 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar4) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar4) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar4) = 0xffffffffffffffff;
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  local_68 = this->fNeighbours;
  local_60 = local_98->fNeighbours;
  p_Var1 = &(gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header;
  lVar4 = 0;
  do {
    local_50 = lVar4 * 3;
    TPZGeoElSide::TPZGeoElSide(&local_90,local_60 + lVar4,(local_98->super_TPZGeoEl).fMesh);
    local_58 = lVar4;
    while( true ) {
      iVar3 = local_90.fSide;
      local_a0 = (local_90.fGeoEl)->fIndex;
      p_Var2 = (gl2lcElMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[(long)*(size_t *)(p_Var2 + 1) < local_a0]) {
        if (local_a0 <= (long)*(size_t *)(p_Var2 + 1)) {
          p_Var5 = p_Var2;
        }
      }
      p_Var7 = p_Var1;
      if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
         (p_Var7 = (_Rb_tree_header *)p_Var5,
         local_a0 < (long)((_Rb_tree_header *)p_Var5)->_M_node_count)) {
        p_Var7 = p_Var1;
      }
      if (p_Var7 != p_Var1) break;
      if (local_90.fGeoEl == (TPZGeoEl *)0x0) {
        local_48 = &PTR__TPZGeoElSide_01920090;
        local_40 = (TPZGeoEl *)0x0;
        local_38 = -1;
      }
      else {
        (**(code **)(*(long *)local_90.fGeoEl + 0x188))(&local_48,local_90.fGeoEl,local_90.fSide);
      }
      local_90.fSide = local_38;
      local_90.fGeoEl = local_40;
    }
    pmVar6 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             operator[](gl2lcElMap,&local_a0);
    (&local_68->fGeoElIndex)[local_50] = *pmVar6;
    (&local_68->fSide)[local_50 * 2] = iVar3;
    lVar4 = local_58 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}